

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char> *b)

{
  ArrayOptions *pAVar1;
  QChar *pQVar2;
  ulong uVar3;
  Data *pDVar4;
  long lVar5;
  ulong uVar6;
  char16_t *__src;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QChar *it;
  QChar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (a->d).d;
  uVar6 = (a->d).size;
  uVar8 = uVar6 + (b->a).b.d.size + 4;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)uVar6);
    pDVar4 = (a->d).d;
    uVar6 = (a->d).size;
    uVar3 = uVar8;
    if (pDVar4 != (Data *)0x0) goto LAB_001ce9bb;
LAB_001cea03:
    if (uVar3 < uVar6) {
      uVar3 = uVar6;
    }
    QString::reallocData((longlong)a,(AllocationOption)uVar3);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) {
      lVar5 = (pDVar4->super_QArrayData).alloc;
LAB_001cea26:
      if (lVar5 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_001cea2f;
    }
  }
  else {
LAB_001ce9bb:
    lVar5 = (pDVar4->super_QArrayData).alloc;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar5 - uVar6) - lVar7) < (long)uVar8) {
      uVar3 = lVar5 * 2;
      if (lVar5 * 2 < (long)uVar8) {
        uVar3 = uVar8;
      }
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar7 <= (long)uVar3)) goto LAB_001cea03;
      goto LAB_001cea26;
    }
LAB_001cea2f:
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001cea47;
  }
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001cea47:
  local_28 = (QChar *)((a->d).ptr + (a->d).size);
  QVar9.m_data = *(b->a).a;
  QVar9.m_size = 3;
  QAbstractConcatenable::convertFromUtf8(QVar9,&local_28);
  lVar5 = (b->a).b.d.size;
  if (lVar5 != 0) {
    __src = (b->a).b.d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(local_28,__src,lVar5 * 2);
  }
  pQVar2 = local_28 + lVar5;
  local_28 = pQVar2 + 1;
  pQVar2->ucs = (ushort)(byte)b->b;
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}